

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

void __thiscall
TTD::SnapShot::InflateSingleObject
          (SnapShot *this,SnapObject *snpObject,InflateMap *inflator,
          TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *idToSnpObjectMap
          )

{
  fPtr_DoObjectInflation p_Var1;
  bool bVar2;
  int iVar3;
  DependsOnInfo *pDVar4;
  Entry *pEVar5;
  ScriptContext *pSVar6;
  RecyclableObject *obj;
  DynamicObject *pDVar7;
  DynamicObject *obj_00;
  ulong uVar8;
  char local_438 [8];
  char buff [1024];
  
  bVar2 = InflateMap::IsObjectAlreadyInflated(inflator,snpObject->ObjectPtrId);
  if (bVar2) {
    return;
  }
  if ((snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0) &&
     (pDVar4 = snpObject->OptDependsOnInfo, pDVar4->DepOnCount != 0)) {
    uVar8 = 0;
    do {
      pEVar5 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::
               FindSlotForId<false>(idToSnpObjectMap,pDVar4->DepOnPtrArray[uVar8]);
      InflateSingleObject(this,pEVar5->Data,inflator,idToSnpObjectMap);
      uVar8 = uVar8 + 1;
      pDVar4 = snpObject->OptDependsOnInfo;
    } while (uVar8 < pDVar4->DepOnCount);
  }
  if (snpObject->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    p_Var1 = this->m_snapObjectVTableArray[snpObject->SnapObjectTag].InflationFunc;
    if (p_Var1 == (fPtr_DoObjectInflation)0x0) {
      sprintf_s<1024ul>((char (*) [1024])local_438,
                        "We probably forgot to update the vtable with a tag we added.  Tag is [%i].  SnapRuntimeFunctionObject is [%i]"
                        ,(ulong)snpObject->SnapObjectTag,5);
      TTDAbort_unrecoverable_error(local_438);
    }
    pDVar7 = (DynamicObject *)(*p_Var1)(snpObject,inflator);
  }
  else {
    pSVar6 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
    obj = RuntimeContextInfo::LookupKnownObjectFromPath
                    (pSVar6->TTDWellKnownInfo,snpObject->OptWellKnownToken);
    pDVar7 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    pDVar7 = NSSnapObjects::ObjectPropertyReset_WellKnown(snpObject,pDVar7,inflator);
    if (pDVar7 == (DynamicObject *)0x0) {
      TTDAbort_unrecoverable_error("Should always produce a result!!!");
    }
  }
  bVar2 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
  if (bVar2) {
    obj_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(&pDVar7->super_RecyclableObject);
    if (snpObject->IsCrossSite != 0) {
      iVar3 = (*(obj_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(obj_00);
      if (iVar3 == 0) {
        Js::CrossSite::MarshalCrossSite_TTDInflate(obj_00);
      }
    }
  }
  InflateMap::AddObject(inflator,snpObject->ObjectPtrId,&pDVar7->super_RecyclableObject);
  return;
}

Assistant:

void SnapShot::InflateSingleObject(const NSSnapObjects::SnapObject* snpObject, InflateMap* inflator, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*>& idToSnpObjectMap) const
    {
        if(inflator->IsObjectAlreadyInflated(snpObject->ObjectPtrId))
        {
            return;
        }

        if(snpObject->OptDependsOnInfo != nullptr)
        {
            for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
            {
                const NSSnapObjects::SnapObject* depOnObj = idToSnpObjectMap.LookupKnownItem(snpObject->OptDependsOnInfo->DepOnPtrArray[i]);

                //This is recursive but should be shallow
                this->InflateSingleObject(depOnObj, inflator, idToSnpObjectMap);
            }
        }

        Js::RecyclableObject* res = nullptr;
        if(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            res = ctx->TTDWellKnownInfo->LookupKnownObjectFromPath(snpObject->OptWellKnownToken);

            //Well known objects may always be dirty (e.g. we are re-using a context) so we always want to clean them
            res = NSSnapObjects::ObjectPropertyReset_WellKnown(snpObject, Js::VarTo<Js::DynamicObject>(res), inflator);
            TTDAssert(res != nullptr, "Should always produce a result!!!");
        }
        else
        {
            //lookup the inflator function for this object and call it
            NSSnapObjects::fPtr_DoObjectInflation inflateFPtr = this->m_snapObjectVTableArray[(uint32)snpObject->SnapObjectTag].InflationFunc;
            if(inflateFPtr == nullptr)
            {
                char buff[1024];
                sprintf_s(buff, "We probably forgot to update the vtable with a tag we added.  Tag is [%i].  SnapRuntimeFunctionObject is [%i]", (uint32)snpObject->SnapObjectTag, TTD::NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject);
                TTDAssert(inflateFPtr != nullptr, buff);
            }
            res = inflateFPtr(snpObject, inflator);
        }

        if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
        {
            //Always ok to be x-site but if snap was x-site then we must be too
            Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(res);
            if(snpObject->IsCrossSite && !dynObj->IsCrossSiteObject())
            {
                Js::CrossSite::MarshalCrossSite_TTDInflate(dynObj);
            }
        }

        inflator->AddObject(snpObject->ObjectPtrId, res);
    }